

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaAddItemSize(xmlSchemaItemListPtr *list,int initialSize,void *item)

{
  xmlSchemaItemListPtr pxVar1;
  void *item_local;
  int initialSize_local;
  xmlSchemaItemListPtr *list_local;
  
  if (*list == (xmlSchemaItemListPtr)0x0) {
    pxVar1 = xmlSchemaItemListCreate();
    *list = pxVar1;
    if (*list == (xmlSchemaItemListPtr)0x0) {
      return -1;
    }
  }
  xmlSchemaItemListAddSize(*list,initialSize,item);
  return 0;
}

Assistant:

static int
xmlSchemaAddItemSize(xmlSchemaItemListPtr *list, int initialSize, void *item)
{
    if (*list == NULL) {
	*list = xmlSchemaItemListCreate();
	if (*list == NULL)
	    return(-1);
    }
    xmlSchemaItemListAddSize(*list, initialSize, item);
    return(0);
}